

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O1

void __thiscall btVectorX<float>::resize(btVectorX<float> *this,int rows)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = (this->m_storage).m_size;
  if ((iVar1 <= rows) && (iVar1 < rows)) {
    if ((this->m_storage).m_capacity < rows) {
      if (rows == 0) {
        pfVar3 = (float *)0x0;
      }
      else {
        pfVar3 = (float *)btAlignedAllocInternal((long)rows << 2,0x10);
      }
      lVar4 = (long)(this->m_storage).m_size;
      if (0 < lVar4) {
        pfVar2 = (this->m_storage).m_data;
        lVar5 = 0;
        do {
          pfVar3[lVar5] = pfVar2[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      pfVar2 = (this->m_storage).m_data;
      if (pfVar2 != (float *)0x0) {
        if ((this->m_storage).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar2);
        }
        (this->m_storage).m_data = (float *)0x0;
      }
      (this->m_storage).m_ownsMemory = true;
      (this->m_storage).m_data = pfVar3;
      (this->m_storage).m_capacity = rows;
    }
    if (iVar1 < rows) {
      memset((this->m_storage).m_data + iVar1,0,((long)rows - (long)iVar1) * 4);
    }
  }
  (this->m_storage).m_size = rows;
  return;
}

Assistant:

void resize(int rows)
	{
		m_storage.resize(rows);
	}